

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_ExrMetadata_Test::TestBody(Image_ExrMetadata_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  expected;
  bool bVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar4;
  Allocator alloc;
  RGBColorSpace *actual;
  iterator iVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  char *in_R9;
  _Alloc_hider _Var8;
  long lVar9;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Point2i fullRes;
  string filename;
  Bounds2i pb;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageAndMetadata read;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  stringVectors;
  Image image;
  AssertHelper local_5d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  key_type local_5b8;
  AssertHelper local_598;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_590;
  string local_588;
  Bounds2<int> local_568;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_558;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_538;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [32];
  long local_4d8 [2];
  long local_4c8 [13];
  polymorphic_allocator<unsigned_char> local_460;
  uchar *local_458;
  size_t local_450;
  size_t local_448;
  polymorphic_allocator<pbrt::Half> local_440;
  Half *local_438;
  size_t local_430;
  size_t local_428;
  polymorphic_allocator<float> local_420;
  float *local_418;
  size_t local_410;
  size_t local_408;
  ImageMetadata local_400;
  ColorEncodingHandle local_300;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_2f8;
  Image local_2c8;
  SquareMatrix<4> local_1b0;
  SquareMatrix<4> local_170;
  ImageMetadata local_130;
  
  GetFloatPixels(&local_538,(Point2i)0x2000000010,3);
  local_130.renderTimeSeconds = (optional<float>)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_558,&local_538,(polymorphic_allocator<float> *)&local_130);
  local_518._0_8_ = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"R","");
  _Var6._M_p = local_4f8 + 0x10;
  local_4f8._0_8_ = _Var6._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"G","");
  _Var8._M_p = (pointer)local_4c8;
  local_4d8[0] = (long)_Var8._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"B","");
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518;
  pbrt::Image::Image(&local_2c8,&local_558,(Point2i)0x2000000010,channels);
  lVar9 = -0x60;
  do {
    if ((long *)_Var8._M_p != *(long **)((long)_Var8._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var8._M_p + -0x10),*(long *)_Var8._M_p + 1);
    }
    _Var8._M_p = _Var8._M_p + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_558.nStored = 0;
  (*(local_558.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_558.alloc.memoryResource,local_558.ptr,local_558.nAlloc << 2,4);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"metadata.exr","");
  local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var2 = &local_2f8._M_impl.super__Rb_tree_header;
  local_130.cameraFromWorld.set = false;
  local_130.NDCFromWorld.set = false;
  local_130.pixelBounds.set = false;
  local_130.fullResolution.set = false;
  local_130.samplesPerPixel.set = false;
  local_130.MSE.set = false;
  local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170.m[0][0] = 3.0;
  local_170.m[0][1] = 1.0;
  local_170.m[0][2] = 4.0;
  local_170.m[0][3] = 1.0;
  local_170.m[1][0] = 5.0;
  local_170.m[1][1] = 9.0;
  local_170.m[1][2] = 2.0;
  local_170.m[1][3] = 3.1415927;
  local_170.m[2][0] = 2.0;
  local_170.m[2][1] = 7.0;
  local_170.m[2][2] = 1.0;
  local_170.m[2][3] = 8.0;
  local_170.m[3][0] = 2.0;
  local_170.m[3][1] = 8.0;
  local_170.m[3][2] = 1.0;
  local_170.m[3][3] = 2.7182817;
  local_1b0.m[0][0] = 1.5;
  local_1b0.m[0][1] = 2.5;
  local_1b0.m[0][2] = 3.5;
  local_1b0.m[0][3] = 4.75;
  local_1b0.m[1][0] = 5.333;
  local_1b0.m[1][1] = 6.2135;
  local_1b0.m[1][2] = -351.2;
  local_1b0.m[1][3] = -552.0;
  local_1b0.m[2][0] = 63.2;
  local_1b0.m[2][1] = 47.2;
  local_1b0.m[2][2] = 3.1415927;
  local_1b0.m[2][3] = 0.5403023;
  local_1b0.m[3][0] = 0.0;
  local_1b0.m[3][1] = -14.0;
  local_1b0.m[3][2] = 6.0;
  local_1b0.m[3][3] = 1e-10;
  local_130.colorSpace.optionalValue = pbrt::RGBColorSpace::Rec2020;
  local_130.colorSpace.set = true;
  local_130.renderTimeSeconds.optionalValue =
       (aligned_storage_t<sizeof(float),_alignof(float)>)0x449a4000;
  local_130.renderTimeSeconds.set = true;
  local_568.pMin.super_Tuple2<pbrt::Point2,_int>.x = 2;
  local_568.pMin.super_Tuple2<pbrt::Point2,_int>.y = 10;
  local_568.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0x12;
  local_568.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0x2a;
  local_590 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0xc8000003e8
  ;
  local_518._0_8_ = local_508;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"foo","");
  local_4f8._0_8_ = _Var6._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"bar","");
  paVar1 = &local_5b8.field_2;
  local_5b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"yolo","");
  pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&local_2f8,&local_5b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>(pvVar4,local_518,local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  lVar9 = -0x40;
  do {
    if ((long *)_Var6._M_p != *(long **)((long)_Var6._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var6._M_p + -0x10),*(long *)_Var6._M_p + 1);
    }
    _Var6._M_p = _Var6._M_p + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_130.cameraFromWorld.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)local_170.m[0][0];
  local_130.cameraFromWorld.optionalValue._4_4_ = local_170.m[0][1];
  local_130.cameraFromWorld.optionalValue._8_4_ = local_170.m[0][2];
  local_130.cameraFromWorld.optionalValue._12_4_ = local_170.m[0][3];
  local_130.cameraFromWorld.optionalValue._16_4_ = local_170.m[1][0];
  local_130.cameraFromWorld.optionalValue._20_4_ = local_170.m[1][1];
  local_130.cameraFromWorld.optionalValue._24_4_ = local_170.m[1][2];
  local_130.cameraFromWorld.optionalValue._28_4_ = local_170.m[1][3];
  local_130.cameraFromWorld.optionalValue._32_4_ = local_170.m[2][0];
  local_130.cameraFromWorld.optionalValue._36_4_ = local_170.m[2][1];
  local_130.cameraFromWorld.optionalValue._40_4_ = local_170.m[2][2];
  local_130.cameraFromWorld.optionalValue._44_4_ = local_170.m[2][3];
  local_130.cameraFromWorld.optionalValue._48_4_ = local_170.m[3][0];
  local_130.cameraFromWorld.optionalValue._52_4_ = local_170.m[3][1];
  local_130.cameraFromWorld.optionalValue._56_4_ = local_170.m[3][2];
  local_130.cameraFromWorld.optionalValue._60_4_ = local_170.m[3][3];
  local_130.cameraFromWorld.set = true;
  local_130.NDCFromWorld.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)local_1b0.m[0][0];
  local_130.NDCFromWorld.optionalValue._4_4_ = local_1b0.m[0][1];
  local_130.NDCFromWorld.optionalValue._8_4_ = local_1b0.m[0][2];
  local_130.NDCFromWorld.optionalValue._12_4_ = local_1b0.m[0][3];
  local_130.NDCFromWorld.optionalValue._16_4_ = local_1b0.m[1][0];
  local_130.NDCFromWorld.optionalValue._20_4_ = local_1b0.m[1][1];
  local_130.NDCFromWorld.optionalValue._24_4_ = local_1b0.m[1][2];
  local_130.NDCFromWorld.optionalValue._28_4_ = local_1b0.m[1][3];
  local_130.NDCFromWorld.optionalValue._32_4_ = local_1b0.m[2][0];
  local_130.NDCFromWorld.optionalValue._36_4_ = local_1b0.m[2][1];
  local_130.NDCFromWorld.optionalValue._40_4_ = local_1b0.m[2][2];
  local_130.NDCFromWorld.optionalValue._44_4_ = local_1b0.m[2][3];
  local_130.NDCFromWorld.optionalValue._48_4_ = local_1b0.m[3][0];
  local_130.NDCFromWorld.optionalValue._52_4_ = local_1b0.m[3][1];
  local_130.NDCFromWorld.optionalValue._56_4_ = local_1b0.m[3][2];
  local_130.NDCFromWorld.optionalValue._60_4_ = local_1b0.m[3][3];
  local_130.NDCFromWorld.set = true;
  local_130.pixelBounds.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)local_568.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  local_130.pixelBounds.optionalValue._4_4_ = local_568.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  local_130.pixelBounds.optionalValue._8_4_ = local_568.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  local_130.pixelBounds.optionalValue._12_4_ = local_568.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  local_130.pixelBounds.set = true;
  local_130.fullResolution.optionalValue = local_590;
  local_130.fullResolution.set = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator=(&local_130.stringVectors._M_t,&local_2f8);
  bVar3 = pbrt::Image::Write(&local_2c8,&local_588,&local_130);
  local_5b8._M_dataplus._M_p._0_1_ = bVar3;
  local_5b8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_518,(internal *)&local_5b8,
               (AssertionResult *)"image.Write(filename, outMetadata)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1ad,(char *)local_518._0_8_);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if ((undefined1 *)local_518._0_8_ != local_508) {
      operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
    }
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_300.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)local_518,&local_588,alloc,&local_300);
  expected = pbrt::RGBColorSpace::Rec2020;
  actual = pbrt::ImageMetadata::GetColorSpace(&local_400);
  testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((internal *)&local_5b8,"*RGBColorSpace::Rec2020","*inMetadata.GetColorSpace()",
             (RGBColorSpace *)expected,actual);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_400.renderTimeSeconds.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_400.renderTimeSeconds.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,
               (AssertionResult *)"(bool)inMetadata.renderTimeSeconds","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b4,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_4_ = 0x4d2;
  if (local_400.renderTimeSeconds.set == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_5b8,"1234","*inMetadata.renderTimeSeconds",(int *)&local_5c8,
             (float *)&local_400);
  if ((char)local_5b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_5c8);
    if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_5b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b5,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    if (local_5c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_5c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c8.ptr_._0_1_ = local_400.cameraFromWorld.set;
  local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_400.cameraFromWorld.set == false) {
    testing::Message::Message((Message *)&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5b8,(internal *)&local_5c8,
               (AssertionResult *)"(bool)inMetadata.cameraFromWorld","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b7,local_5b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_400.cameraFromWorld.set != false) {
    testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
              ((internal *)&local_5b8,"*inMetadata.cameraFromWorld","w2c",
               (SquareMatrix<4> *)&local_400.cameraFromWorld,&local_170);
    if ((char)local_5b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_5c8);
      if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_5b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1b8,pcVar7);
      testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
      testing::internal::AssertHelper::~AssertHelper(&local_5d0);
      if (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_5c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_5c8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_5b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_5c8.ptr_._0_1_ = local_400.NDCFromWorld.set;
    local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_400.NDCFromWorld.set == false) {
      testing::Message::Message((Message *)&local_5d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5b8,(internal *)&local_5c8,
                 (AssertionResult *)"(bool)inMetadata.NDCFromWorld","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_598,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1ba,local_5b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
      testing::internal::AssertHelper::~AssertHelper(&local_598);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != (long *)0x0)
           ) {
          (**(code **)(*(long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_400.NDCFromWorld.set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
              ((internal *)&local_5b8,"*inMetadata.NDCFromWorld","w2n",
               (SquareMatrix<4> *)&local_400.NDCFromWorld,&local_1b0);
    if ((char)local_5b8._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_5c8);
      if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_5b8._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1bb,pcVar7);
      testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
      testing::internal::AssertHelper::~AssertHelper(&local_5d0);
      if (local_5c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_5c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_5c8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_5b8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_5c8.ptr_._0_1_ = local_400.pixelBounds.set;
    local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_400.pixelBounds.set == false) {
      testing::Message::Message((Message *)&local_5d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5b8,(internal *)&local_5c8,(AssertionResult *)"(bool)inMetadata.pixelBounds"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_598,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1bd,local_5b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
      testing::internal::AssertHelper::~AssertHelper(&local_598);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != (long *)0x0)
           ) {
          (**(code **)(*(long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_400.pixelBounds.set != false) {
      testing::internal::CmpHelperEQ<pbrt::Bounds2<int>,pbrt::Bounds2<int>>
                ((internal *)&local_5b8,"*inMetadata.pixelBounds","pb",
                 (Bounds2<int> *)&local_400.pixelBounds,&local_568);
      if ((char)local_5b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_5c8);
        if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_5b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x1be,pcVar7);
        testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
        testing::internal::AssertHelper::~AssertHelper(&local_5d0);
        if (local_5c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_5c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_5c8.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_5b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_5c8.ptr_._0_1_ = local_400.fullResolution.set;
      local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_400.fullResolution.set == false) {
        testing::Message::Message((Message *)&local_5d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_5b8,(internal *)&local_5c8,
                   (AssertionResult *)"(bool)inMetadata.fullResolution","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_598,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x1c0,local_5b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
        testing::internal::AssertHelper::~AssertHelper(&local_598);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        if (CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != 0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             ((long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_400.fullResolution.set != false) {
        testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
                  ((internal *)&local_5b8,"*inMetadata.fullResolution","fullRes",
                   (Point2<int> *)&local_400.fullResolution,(Point2<int> *)&local_590.__align);
        if ((char)local_5b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_5c8);
          if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_5b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_5d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1c1,pcVar7);
          testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
          testing::internal::AssertHelper::~AssertHelper(&local_5d0);
          if (local_5c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_5c8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_5c8.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_5d0.data_._0_4_ = 1;
        local_5c8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_400.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_5b8,"1","inMetadata.stringVectors.size()",(int *)&local_5d0,
                   (unsigned_long *)&local_5c8);
        if ((char)local_5b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_5c8);
          if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_5b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_5d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1c3,pcVar7);
          testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
          testing::internal::AssertHelper::~AssertHelper(&local_5d0);
          if (local_5c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_5c8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_5c8.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_5b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"yolo","");
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::find(&local_2f8,&local_5b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        local_5c8.ptr_._0_1_ = (_Rb_tree_header *)iVar5._M_node != p_Var2;
        local_5c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
          testing::Message::Message((Message *)&local_5d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_5b8,(internal *)&local_5c8,
                     (AssertionResult *)"iter != stringVectors.end()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_598,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1c5,local_5b8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_5d0);
          testing::internal::AssertHelper::~AssertHelper(&local_598);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          if (CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != 0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               ((long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_5d0.data_._4_4_,(int)local_5d0.data_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_5c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                  ((internal *)&local_5b8,"\"foo\"","iter->second[0]",(char (*) [4])"foo",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (iVar5._M_node + 2));
        if ((char)local_5b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_5c8);
          if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_5b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_5d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1c6,pcVar7);
          testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
          testing::internal::AssertHelper::~AssertHelper(&local_5d0);
          if (local_5c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_5c8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_5c8.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                  ((internal *)&local_5b8,"\"bar\"","iter->second[1]",(char (*) [4])"bar",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(iVar5._M_node + 2) + 0x20));
        if ((char)local_5b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_5c8);
          if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_5b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_5d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1c7,pcVar7);
          testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
          testing::internal::AssertHelper::~AssertHelper(&local_5d0);
          if (local_5c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_5c8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_5c8.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_5c8.ptr_ = local_5c8.ptr_ & 0xffffffff00000000;
        local_5d0.data_._0_4_ = remove(local_588._M_dataplus._M_p);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_5b8,"0","remove(filename.c_str())",(int *)&local_5c8,
                   (int *)&local_5d0);
        if ((char)local_5b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_5c8);
          if ((undefined8 *)local_5b8._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_5b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_5d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1c9,pcVar7);
          testing::internal::AssertHelper::operator=(&local_5d0,(Message *)&local_5c8);
          testing::internal::AssertHelper::~AssertHelper(&local_5d0);
          if (local_5c8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_5c8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_5c8.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_400.stringVectors._M_t);
        if (local_400.colorSpace.set == true) {
          local_400.colorSpace.set = false;
        }
        if (local_400.MSE.set == true) {
          local_400.MSE.set = false;
        }
        if (local_400.samplesPerPixel.set == true) {
          local_400.samplesPerPixel.set = false;
        }
        if (local_400.fullResolution.set == true) {
          local_400.fullResolution.set = false;
        }
        if (local_400.pixelBounds.set == true) {
          local_400.pixelBounds.set = false;
        }
        if (local_400.NDCFromWorld.set == true) {
          local_400.NDCFromWorld.set = false;
        }
        if (local_400.cameraFromWorld.set == true) {
          local_400.cameraFromWorld.set = false;
        }
        if (local_400.renderTimeSeconds.set == true) {
          local_400.renderTimeSeconds.set = false;
        }
        local_408 = 0;
        (*(local_420.memoryResource)->_vptr_memory_resource[3])
                  (local_420.memoryResource,local_418,local_410 << 2,4);
        local_428 = 0;
        (*(local_440.memoryResource)->_vptr_memory_resource[3])
                  (local_440.memoryResource,local_438,local_430 * 2,2);
        local_448 = 0;
        (*(local_460.memoryResource)->_vptr_memory_resource[3])
                  (local_460.memoryResource,local_458,local_450,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_508);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_2f8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_130.stringVectors._M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        local_2c8.p32.nStored = 0;
        (*(local_2c8.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_2c8.p32.alloc.memoryResource,local_2c8.p32.ptr,local_2c8.p32.nAlloc << 2,4)
        ;
        local_2c8.p16.nStored = 0;
        (*(local_2c8.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_2c8.p16.alloc.memoryResource,local_2c8.p16.ptr,local_2c8.p16.nAlloc * 2,2);
        local_2c8.p8.nStored = 0;
        (*(local_2c8.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_2c8.p8.alloc.memoryResource,local_2c8.p8.ptr,local_2c8.p8.nAlloc,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&local_2c8.channelNames);
        local_538.nStored = 0;
        (*(local_538.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_538.alloc.memoryResource,local_538.ptr,local_538.nAlloc << 2,4);
        return;
      }
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
  pbrt::LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
}

Assistant:

TEST(Image, ExrMetadata) {
    Point2i res(16, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);
    Image image(rgbPixels, res, {"R", "G", "B"});

    std::string filename = "metadata.exr";
    ImageMetadata outMetadata;
    outMetadata.colorSpace = RGBColorSpace::Rec2020;
    outMetadata.renderTimeSeconds = 1234;
    SquareMatrix<4> w2c(3, 1, 4, 1, 5, 9, 2, Pi, 2, 7, 1, 8, 2, 8, 1, std::exp(1.f));
    SquareMatrix<4> w2n(1.5, 2.5, 3.5, 4.75, 5.333, 6.2135, -351.2, -552., 63.2, 47.2, Pi,
                        std::cos(1.f), 0, -14, 6, 1e-10f);
    // Must be the same area as image resolution.
    Bounds2i pb(Point2i(2, 10), Point2i(18, 42));
    Point2i fullRes(1000, 200);
    std::map<std::string, std::vector<std::string>> stringVectors;
    stringVectors["yolo"] = {"foo", "bar"};

    outMetadata.cameraFromWorld = w2c;
    outMetadata.NDCFromWorld = w2n;
    outMetadata.pixelBounds = pb;
    outMetadata.fullResolution = fullRes;
    outMetadata.stringVectors = stringVectors;
    EXPECT_TRUE(image.Write(filename, outMetadata));

    ImageAndMetadata read = Image::Read(filename);
    ImageMetadata &inMetadata = read.metadata;

    EXPECT_EQ(*RGBColorSpace::Rec2020, *inMetadata.GetColorSpace());

    EXPECT_TRUE((bool)inMetadata.renderTimeSeconds);
    EXPECT_EQ(1234, *inMetadata.renderTimeSeconds);

    EXPECT_TRUE((bool)inMetadata.cameraFromWorld);
    EXPECT_EQ(*inMetadata.cameraFromWorld, w2c);

    EXPECT_TRUE((bool)inMetadata.NDCFromWorld);
    EXPECT_EQ(*inMetadata.NDCFromWorld, w2n);

    EXPECT_TRUE((bool)inMetadata.pixelBounds);
    EXPECT_EQ(*inMetadata.pixelBounds, pb);

    EXPECT_TRUE((bool)inMetadata.fullResolution);
    EXPECT_EQ(*inMetadata.fullResolution, fullRes);

    EXPECT_EQ(1, inMetadata.stringVectors.size());
    auto iter = stringVectors.find("yolo");
    EXPECT_TRUE(iter != stringVectors.end());
    EXPECT_EQ("foo", iter->second[0]);
    EXPECT_EQ("bar", iter->second[1]);

    EXPECT_EQ(0, remove(filename.c_str()));
}